

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

uint64_t __thiscall banksia::BoardCore::xorHashKey(BoardCore *this,int pos)

{
  pointer pPVar1;
  long lVar2;
  
  lVar2 = (long)pos;
  pPVar1 = (this->pieces).super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>.
           _M_impl.super__Vector_impl_data._M_start;
  return hashTable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start
         [((long)(int)pPVar1[lVar2].side * 7 + (long)(int)pPVar1[lVar2].type) *
          ((ulong)((long)(this->pieces).
                         super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)pPVar1) >> 3) + lVar2];
}

Assistant:

u64 BoardCore::xorHashKey(int pos) const
{
    assert(isPositionValid(pos ));
    
    assert(!pieces[size_t(pos)].isEmpty());
    int sd = static_cast<int>(pieces[size_t(pos)].side);
    int p = static_cast<int>(pieces[size_t(pos)].type);
    
    auto sz = pieces.size(); assert(sz == 64);
    auto h = sd * 7 * sz + p * sz + size_t(pos); assert(h < hashTable.size());
    return hashTable[h];
}